

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec07.c
# Opt level: O1

int If_Dec7PickBestMux(word *t,word *c0r,word *c1r)

{
  ulong uVar1;
  ulong uVar2;
  byte bVar3;
  ulong uVar4;
  ulong uVar5;
  int Count_1;
  uint uVar6;
  int Count;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  int v;
  long lVar11;
  word *pwVar12;
  ulong uVar13;
  ulong uVar14;
  int local_58;
  int local_54;
  
  local_58 = -1;
  local_54 = 1000;
  lVar10 = 0;
  do {
    pwVar12 = Truth6;
    uVar14 = *t;
    if (lVar10 == 6) {
      uVar4 = t[1];
      uVar2 = uVar4;
      uVar1 = uVar14;
    }
    else {
      uVar14 = uVar14 & ~Truth6[lVar10];
      bVar3 = (byte)(1 << ((byte)lVar10 & 0x1f));
      uVar14 = uVar14 << (bVar3 & 0x3f) | uVar14;
      uVar1 = ~Truth6[lVar10] & t[1];
      uVar1 = uVar1 << (bVar3 & 0x3f) | uVar1;
      uVar2 = *t & Truth6[lVar10];
      bVar3 = (byte)(1 << ((byte)lVar10 & 0x1f));
      uVar2 = uVar2 >> (bVar3 & 0x3f) | uVar2;
      uVar4 = Truth6[lVar10] & t[1];
      uVar4 = uVar4 >> (bVar3 & 0x3f) | uVar4;
    }
    lVar11 = 0;
    uVar7 = 0;
    do {
      uVar13 = uVar1;
      uVar9 = uVar1;
      uVar5 = uVar14;
      uVar8 = uVar14;
      if (lVar11 != 6) {
        uVar8 = uVar14 & ~*pwVar12;
        bVar3 = (byte)(1 << ((byte)lVar11 & 0x1f));
        uVar8 = uVar8 << (bVar3 & 0x3f) | uVar8;
        uVar5 = ~*pwVar12 & uVar1;
        uVar5 = uVar5 << (bVar3 & 0x3f) | uVar5;
        uVar13 = *pwVar12 & uVar14;
        bVar3 = (byte)(1 << ((byte)lVar11 & 0x1f));
        uVar13 = uVar13 >> (bVar3 & 0x3f) | uVar13;
        uVar9 = *pwVar12 & uVar1;
        uVar9 = uVar9 >> (bVar3 & 0x3f) | uVar9;
      }
      uVar7 = uVar7 + (uVar8 != uVar13 || uVar5 != uVar9);
      lVar11 = lVar11 + 1;
      pwVar12 = pwVar12 + 1;
    } while (lVar11 != 7);
    lVar11 = 0;
    pwVar12 = Truth6;
    uVar6 = 0;
    do {
      uVar13 = uVar4;
      uVar9 = uVar4;
      uVar5 = uVar2;
      uVar8 = uVar2;
      if (lVar11 != 6) {
        uVar5 = uVar2 & ~*pwVar12;
        bVar3 = (byte)(1 << ((byte)lVar11 & 0x1f));
        uVar5 = uVar5 << (bVar3 & 0x3f) | uVar5;
        uVar8 = ~*pwVar12 & uVar4;
        uVar8 = uVar8 << (bVar3 & 0x3f) | uVar8;
        uVar9 = *pwVar12 & uVar2;
        bVar3 = (byte)(1 << ((byte)lVar11 & 0x1f));
        uVar9 = uVar9 >> (bVar3 & 0x3f) | uVar9;
        uVar13 = *pwVar12 & uVar4;
        uVar13 = uVar13 >> (bVar3 & 0x3f) | uVar13;
      }
      uVar6 = uVar6 + (uVar5 != uVar9 || uVar8 != uVar13);
      lVar11 = lVar11 + 1;
      pwVar12 = pwVar12 + 1;
    } while (lVar11 != 7);
    if (((uVar7 < 5) && (uVar6 < 5)) && ((int)(uVar6 + uVar7) < local_54)) {
      *c0r = uVar14;
      c0r[1] = uVar1;
      *c1r = uVar2;
      c1r[1] = uVar4;
      local_58 = (int)lVar10;
      local_54 = uVar6 + uVar7;
    }
    lVar10 = lVar10 + 1;
  } while (lVar10 != 7);
  return local_58;
}

Assistant:

int If_Dec7PickBestMux( word t[2], word c0r[2], word c1r[2] )
{
    word c0[2], c1[2];
    int v, vBest = -1, Count0, Count1, CountBest = 1000;
    for ( v = 0; v < 7; v++ )
    {
        If_Dec7Cofactor( t, v, 0, c0 );
        If_Dec7Cofactor( t, v, 1, c1 );
        Count0 = If_Dec7SuppSize(c0);
        Count1 = If_Dec7SuppSize(c1);
        if ( Count0 < 5 && Count1 < 5 && CountBest > Count0 + Count1 )
        {
            CountBest = Count0 + Count1;
            vBest = v;
            c0r[0] = c0[0]; c0r[1] = c0[1];
            c1r[0] = c1[0]; c1r[1] = c1[1];
        }
    }
    return vBest;
}